

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O1

void __thiscall
CNetAddr::
UnserializeV2Stream<ParamsStream<ParamsStream<AutoFile&,CAddress::SerParams>&,CNetAddr::SerParams>>
          (CNetAddr *this,
          ParamsStream<ParamsStream<AutoFile_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *s)

{
  uchar *puVar1;
  uchar *puVar2;
  uint uVar3;
  uint8_t possible_bip155_net;
  bool bVar4;
  string *psVar5;
  uint uVar6;
  size_t in_RCX;
  CNetAddr *pCVar7;
  long lVar8;
  int __fd;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  long in_FS_OFFSET;
  size_t address_size;
  uint8_t obj;
  size_t local_50;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::read(s->m_substream->m_substream,(int)&local_48,(void *)0x1,in_RCX);
  possible_bip155_net = (uint8_t)local_48._M_dataplus._M_p;
  local_50 = ReadCompactSize<ParamsStream<ParamsStream<AutoFile&,CAddress::SerParams>&,CNetAddr::SerParams>>
                       (s,true);
  if (local_50 < 0x201) {
    this->m_scope_id = 0;
    bVar4 = SetNetFromBIP155Network(this,possible_bip155_net,local_50);
    if (bVar4) {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,(size_type)local_50);
      uVar3 = (this->m_addr)._size;
      __fd = (int)*(undefined8 *)&(this->m_addr)._union;
      uVar6 = uVar3 - 0x11;
      if (uVar3 < 0x11) {
        __fd = (int)this;
        uVar6 = uVar3;
      }
      AutoFile::read(s->m_substream->m_substream,__fd,(void *)(ulong)uVar6,in_RCX);
      if (this->m_net == NET_IPV6) {
        uVar3 = (this->m_addr)._size;
        uVar6 = uVar3 - 0x11;
        if (uVar3 < 0x11) {
          uVar6 = uVar3;
        }
        if (5 < uVar6) {
          pCVar7 = this;
          if (0x10 < uVar3) {
            pCVar7 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
          }
          if ((pCVar7->m_addr)._union.direct[0] == -3) {
            lVar8 = 1;
            do {
              if (lVar8 == 6) {
                this->m_net = NET_INTERNAL;
                pCVar7 = this;
                if (0x10 < uVar3) {
                  pCVar7 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
                }
                (pCVar7->m_addr)._union.indirect_contents.indirect =
                     *(char **)((long)&(pCVar7->m_addr)._union.indirect_contents.indirect + 6);
                *(undefined2 *)((long)&(pCVar7->m_addr)._union + 8) =
                     *(undefined2 *)((long)&(pCVar7->m_addr)._union + 0xe);
                prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,10);
                goto LAB_0044f677;
              }
              puVar1 = INTERNAL_IN_IPV6_PREFIX._M_elems + lVar8;
              puVar2 = (uchar *)((pCVar7->m_addr)._union.direct + lVar8);
              lVar8 = lVar8 + 1;
            } while (*puVar1 == *puVar2);
          }
        }
        if (0xb < uVar6) {
          pCVar7 = this;
          if (0x10 < uVar3) {
            pCVar7 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
          }
          if ((pCVar7->m_addr)._union.direct[0] == '\0') {
            lVar8 = 1;
            do {
              if (lVar8 == 0xc) goto LAB_0044f65b;
              puVar1 = IPV4_IN_IPV6_PREFIX._M_elems + lVar8;
              puVar2 = (uchar *)((pCVar7->m_addr)._union.direct + lVar8);
              lVar8 = lVar8 + 1;
            } while (*puVar1 == *puVar2);
          }
        }
        if (5 < uVar6) {
          pCVar7 = this;
          if (0x10 < uVar3) {
            pCVar7 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
          }
          if ((pCVar7->m_addr)._union.direct[0] == -3) {
            lVar8 = 1;
            do {
              if (lVar8 == 6) goto LAB_0044f65b;
              puVar1 = TORV2_IN_IPV6_PREFIX._M_elems + lVar8;
              puVar2 = (uchar *)((pCVar7->m_addr)._union.direct + lVar8);
              lVar8 = lVar8 + 1;
            } while (*puVar1 == *puVar2);
          }
        }
      }
    }
    else {
      AutoFile::ignore(s->m_substream->m_substream,local_50);
LAB_0044f65b:
      this->m_net = NET_IPV6;
      local_48._M_dataplus._M_p._0_1_ = '\0';
      prevector<16U,_unsigned_char,_unsigned_int,_int>::assign
                (&this->m_addr,0x10,(uchar *)&local_48);
    }
LAB_0044f677:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    psVar5 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_long,unsigned_long>
              (&local_48,(tinyformat *)"Address too long: %u > %u",(char *)&local_50,
               &MAX_ADDRV2_SIZE,(unsigned_long *)CONCAT71(in_register_00000081,in_R8B));
    std::ios_base::failure[abi:cxx11]::failure(psVar5);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(psVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void UnserializeV2Stream(Stream& s)
    {
        uint8_t bip155_net;
        s >> bip155_net;

        size_t address_size;
        s >> COMPACTSIZE(address_size);

        if (address_size > MAX_ADDRV2_SIZE) {
            throw std::ios_base::failure(strprintf(
                "Address too long: %u > %u", address_size, MAX_ADDRV2_SIZE));
        }

        m_scope_id = 0;

        if (SetNetFromBIP155Network(bip155_net, address_size)) {
            m_addr.resize(address_size);
            s >> Span{m_addr};

            if (m_net != NET_IPV6) {
                return;
            }

            // Do some special checks on IPv6 addresses.

            // Recognize NET_INTERNAL embedded in IPv6, such addresses are not
            // gossiped but could be coming from addrman, when unserializing from
            // disk.
            if (util::HasPrefix(m_addr, INTERNAL_IN_IPV6_PREFIX)) {
                m_net = NET_INTERNAL;
                memmove(m_addr.data(), m_addr.data() + INTERNAL_IN_IPV6_PREFIX.size(),
                        ADDR_INTERNAL_SIZE);
                m_addr.resize(ADDR_INTERNAL_SIZE);
                return;
            }

            if (!util::HasPrefix(m_addr, IPV4_IN_IPV6_PREFIX) &&
                !util::HasPrefix(m_addr, TORV2_IN_IPV6_PREFIX)) {
                return;
            }

            // IPv4 and TORv2 are not supposed to be embedded in IPv6 (like in V1
            // encoding). Unserialize as !IsValid(), thus ignoring them.
        } else {
            // If we receive an unknown BIP155 network id (from the future?) then
            // ignore the address - unserialize as !IsValid().
            s.ignore(address_size);
        }

        // Mimic a default-constructed CNetAddr object which is !IsValid() and thus
        // will not be gossiped, but continue reading next addresses from the stream.
        m_net = NET_IPV6;
        m_addr.assign(ADDR_IPV6_SIZE, 0x0);
    }